

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
duckdb::RandomInitLocalState
          (ExpressionState *state,BoundFunctionExpression *expr,FunctionData *bind_data)

{
  int iVar1;
  ClientContext *pCVar2;
  pthread_mutex_t *__mutex;
  uint64_t seed;
  RandomLocalState *this;
  undefined8 uVar3;
  void *unaff_R15;
  
  pCVar2 = (ClientContext *)duckdb::ExpressionState::GetContext();
  __mutex = (pthread_mutex_t *)duckdb::RandomEngine::Get(pCVar2);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    seed = duckdb::RandomEngine::NextRandomInteger64();
    this = (RandomLocalState *)operator_new(0x38);
    RandomLocalState::RandomLocalState(this,seed);
    *(RandomLocalState **)state = this;
    pthread_mutex_unlock(__mutex);
    return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
           )(unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>
             )state;
  }
  uVar3 = std::__throw_system_error(iVar1);
  operator_delete(unaff_R15);
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

static unique_ptr<FunctionLocalState> RandomInitLocalState(ExpressionState &state, const BoundFunctionExpression &expr,
                                                           FunctionData *bind_data) {
	auto &random_engine = RandomEngine::Get(state.GetContext());
	lock_guard<mutex> guard(random_engine.lock);
	return make_uniq<RandomLocalState>(random_engine.NextRandomInteger64());
}